

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_find_ovf_fup(pt_packet_decoder *pacdec)

{
  int iVar1;
  undefined1 local_160 [4];
  int errcode;
  pt_packet packet;
  undefined1 local_140 [4];
  int offset;
  pt_packet_decoder decoder;
  pt_packet_decoder *pacdec_local;
  
  if (pacdec == (pt_packet_decoder *)0x0) {
    return -1;
  }
  decoder.sync = (uint8_t *)pacdec;
  memcpy(local_140,pacdec,0x128);
  packet.payload.tnt.payload._4_4_ = 0;
  while( true ) {
    iVar1 = pt_pkt_next((pt_packet_decoder *)local_140,(pt_packet *)local_160,0x18);
    if (iVar1 < 0) {
      return iVar1;
    }
    if ((byte)errcode == 0) break;
    packet.payload.tnt.payload._4_4_ = (uint)(byte)errcode + packet.payload.tnt.payload._4_4_;
    if ((int)packet.payload.tnt.payload._4_4_ < 0) {
      return -0x19;
    }
    switch(local_160) {
    case (undefined1  [4])0x0:
    case (undefined1  [4])0x1:
    case (undefined1  [4])0x2:
    case (undefined1  [4])0xe:
    case (undefined1  [4])0xf:
    case (undefined1  [4])0x10:
    case (undefined1  [4])0x11:
    case (undefined1  [4])0x12:
    case (undefined1  [4])0x15:
      break;
    case (undefined1  [4])0x3:
    case (undefined1  [4])0x7:
    case (undefined1  [4])0xb:
    case (undefined1  [4])0xc:
    case (undefined1  [4])0xd:
    case (undefined1  [4])0x13:
    case (undefined1  [4])0x14:
    case (undefined1  [4])0x16:
    case (undefined1  [4])0x17:
    case (undefined1  [4])0x18:
    case (undefined1  [4])0x19:
    case (undefined1  [4])0x1a:
    case (undefined1  [4])0x1b:
    case (undefined1  [4])0x1c:
      return 0;
    case (undefined1  [4])0x4:
    case (undefined1  [4])0x6:
    case (undefined1  [4])0x8:
    case (undefined1  [4])0x9:
    case (undefined1  [4])0xa:
      return -6;
    case (undefined1  [4])0x5:
      return packet.payload.tnt.payload._4_4_;
    }
  }
  return -5;
}

Assistant:

static int pt_evt_find_ovf_fup(const struct pt_packet_decoder *pacdec)
{
	struct pt_packet_decoder decoder;
	int offset;

	if (!pacdec)
		return -pte_internal;

	decoder = *pacdec;
	offset = 0;
	for (;;) {
		struct pt_packet packet;
		int errcode;

		errcode = pt_pkt_next(&decoder, &packet, sizeof(packet));
		if (errcode < 0)
			return errcode;

		if (!packet.size)
			return -pte_bad_packet;

		offset += packet.size;
		if (offset < 0)
			return -pte_overflow;

		switch (packet.type) {
		case ppt_fup:
			return offset;

		case ppt_unknown:
		case ppt_pad:
		case ppt_mnt:
		case ppt_cbr:
		case ppt_tsc:
		case ppt_tma:
		case ppt_mtc:
		case ppt_cyc:
		case ppt_invalid:
			break;

		case ppt_psb:
		case ppt_tip_pge:
		case ppt_mode:
		case ppt_pip:
		case ppt_vmcs:
		case ppt_stop:
		case ppt_ovf:
		case ppt_exstop:
		case ppt_mwait:
		case ppt_pwre:
		case ppt_pwrx:
		case ppt_ptw:
		case ppt_cfe:
		case ppt_evd:
			return 0;

		case ppt_psbend:
		case ppt_tip:
		case ppt_tip_pgd:
		case ppt_tnt_8:
		case ppt_tnt_64:
			return -pte_bad_context;
		}
	}
}